

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx::forward
          (Yolov3DetectionOutput_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  pointer pMVar2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  iterator __position;
  Mat *this_01;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  float *pfVar14;
  undefined4 *puVar15;
  undefined4 uVar16;
  int iVar17;
  BBoxRect *__args;
  long lVar18;
  float *pfVar19;
  size_t sVar20;
  long in_R10;
  long lVar21;
  int iVar22;
  ulong uVar23;
  uint _h;
  float fVar24;
  float fVar25;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [64];
  float fVar44;
  float fVar45;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 in_register_00001384 [12];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_198;
  ulong local_180;
  BBoxRect local_178;
  long local_150;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_148;
  undefined1 local_128 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_118;
  pointer local_110;
  void *local_108;
  long local_100;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d8;
  Option *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  void *local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = bottom_blobs;
  local_d8 = top_blobs;
  local_d0 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_180 = 0;
    do {
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_198,
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
      pMVar2 = (local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      p_Var3 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
      iVar12 = pMVar2[local_180].c / *(int *)(&this->field_0xd4 + (long)p_Var3);
      if (iVar12 != *(int *)(&this->field_0xd0 + (long)p_Var3) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_198);
        iVar12 = -1;
        goto LAB_002b9402;
      }
      p_Var4 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
      if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
        local_110 = pMVar2 + local_180;
        uVar23._0_4_ = local_110->w;
        uVar23._4_4_ = local_110->h;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar23;
        auVar39 = vcvtdq2ps_avx(auVar26);
        fVar24 = *(float *)(*(long *)(&this->field_0x170 + (long)p_Var3) + local_180 * 4);
        uVar16 = vextractps_avx(auVar26,1);
        local_100 = CONCAT44((int)((ulong)*(long *)(&this->field_0x170 + (long)p_Var3) >> 0x20),
                             uVar16);
        auVar38._0_4_ = fVar24 * auVar39._0_4_;
        auVar38._4_4_ = fVar24 * auVar39._4_4_;
        auVar38._8_4_ = fVar24 * auVar39._8_4_;
        auVar38._12_4_ = fVar24 * auVar39._12_4_;
        in_R10 = CONCAT44((int)((ulong)in_R10 >> 0x20),(undefined4)uVar23);
        local_98 = vroundps_avx(auVar38,0xb);
        local_c0 = (long)iVar12;
        auVar27._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar27._12_4_ = 0x3f000000;
        local_78 = auVar39._0_8_;
        register0x00001248 = auVar27._8_8_;
        auVar26 = vrcpps_avx(_local_78);
        fVar24 = auVar26._0_4_;
        auVar34._0_4_ = auVar39._0_4_ * fVar24;
        fVar25 = auVar26._4_4_;
        auVar34._4_4_ = auVar39._4_4_ * fVar25;
        fVar44 = auVar26._8_4_;
        auVar34._8_4_ = fVar44 * 0.5;
        fVar45 = auVar26._12_4_;
        auVar34._12_4_ = fVar45 * 0.5;
        auVar39._8_4_ = 0x3f800000;
        auVar39._0_8_ = 0x3f8000003f800000;
        auVar39._12_4_ = 0x3f800000;
        auVar39 = vsubps_avx(auVar39,auVar34);
        local_88._0_4_ = fVar24 + fVar24 * auVar39._0_4_;
        local_88._4_4_ = fVar25 + fVar25 * auVar39._4_4_;
        fStack_80 = fVar44 + fVar44 * auVar39._8_4_;
        fStack_7c = fVar45 + fVar45 * auVar39._12_4_;
        local_c8 = (long)*(int *)(&this->field_0xd4 + (long)p_Var3) * local_180 * 4;
        lVar21 = 0;
        local_a8 = in_R10;
        do {
          lVar18 = lVar21 * local_c0;
          if (local_110->dims == 3) {
            sVar20 = local_110->elemsize;
            local_108 = (void *)((lVar18 + 5) * local_110->cstep * sVar20 + (long)local_110->data);
            lVar13 = (long)local_110->h * (long)local_110->w * sVar20;
          }
          else {
            sVar20 = local_110->elemsize;
            local_108 = (void *)((lVar18 + 5) * local_110->cstep * sVar20 + (long)local_110->data);
            lVar13 = (long)local_110->h * (long)local_110->w * (long)local_110->d * sVar20;
          }
          local_150 = lVar21;
          if (0 < (int)local_100) {
            auVar28._8_8_ = 0;
            auVar28._0_8_ =
                 *(ulong *)(*(long *)(&this->field_0xe0 + (long)p_Var4) +
                           (long)((int)*(float *)(*(long *)(&this->field_0x128 + (long)p_Var4) +
                                                  local_c8 + lVar21 * 4) * 2) * 4);
            sVar5 = local_110->cstep;
            pvVar6 = local_110->data;
            sVar7 = local_110->elemsize;
            local_e0 = (float *)(sVar5 * lVar18 * sVar7 + (long)pvVar6);
            local_e8 = (float *)((lVar18 + 1) * sVar5 * sVar7 + (long)pvVar6);
            local_f0 = (float *)((lVar18 + 2) * sVar5 * sVar7 + (long)pvVar6);
            local_f8 = (float *)((lVar18 + 3) * sVar5 * sVar7 + (long)pvVar6);
            pfVar19 = (float *)((lVar18 + 4) * sVar5 * sVar7 + (long)pvVar6);
            iVar12 = (int)((lVar13 + 0xfU & 0xfffffffffffffff0) / sVar20);
            auVar35._8_4_ = 0x3f800000;
            auVar35._0_8_ = 0x3f8000003f800000;
            auVar35._12_4_ = 0x3f800000;
            local_68 = vmovlhps_avx(auVar35,auVar28);
            local_a0 = (long)iVar12;
            lVar21 = 0;
            do {
              local_b8 = lVar21;
              if (0 < (int)in_R10) {
                auVar29._0_4_ = (float)(int)lVar21;
                auVar29._4_12_ = in_register_00001384;
                local_b0 = (void *)((long)local_108 + lVar21 * in_R10 * 4);
                local_58 = vshufps_avx(auVar29,local_98,0x40);
                lVar21 = 0;
                do {
                  p_Var3 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
                  lVar18 = *(int *)(&this->field_0xd0 + (long)p_Var3) * local_a0;
                  if ((int)lVar18 < 1) {
                    iVar22 = 0;
                    local_128 = SUB6416(ZEXT464(0xff7fffff),0);
                  }
                  else {
                    pfVar14 = (float *)((long)local_b0 + lVar21 * 4);
                    pfVar1 = pfVar14 + lVar18;
                    iVar22 = 0;
                    auVar37 = ZEXT464(0xff7fffff);
                    iVar17 = 0;
                    do {
                      if (auVar37._0_4_ < *pfVar14) {
                        iVar22 = iVar17;
                      }
                      local_128 = vmaxss_avx(ZEXT416((uint)*pfVar14),auVar37._0_16_);
                      auVar37 = ZEXT1664(local_128);
                      pfVar14 = pfVar14 + iVar12;
                      iVar17 = iVar17 + 1;
                    } while (pfVar14 < pfVar1);
                  }
                  fVar24 = expf(-*pfVar19);
                  fVar25 = expf(-(float)local_128._0_4_);
                  fVar24 = 1.0 / ((fVar25 + 1.0) * fVar24 + 1.0);
                  if (*(float *)(&this->field_0xd8 + (long)p_Var3) <= fVar24) {
                    fVar25 = expf(-*local_e0);
                    local_128 = ZEXT416((uint)(fVar25 + 1.0));
                    fVar25 = expf(-*local_e8);
                    local_48 = vinsertps_avx(local_128,ZEXT416((uint)(fVar25 + 1.0)),0x10);
                    local_128._0_4_ = expf(*local_f0);
                    local_128._4_4_ = extraout_XMM0_Db;
                    local_128._8_4_ = extraout_XMM0_Dc;
                    local_128._12_4_ = extraout_XMM0_Dd;
                    auVar37._0_4_ = expf(*local_f8);
                    auVar37._4_60_ = extraout_var;
                    auVar26 = vrcpps_avx(local_48);
                    fVar25 = local_68._0_4_ * auVar26._0_4_;
                    fVar44 = local_68._4_4_ * auVar26._4_4_;
                    fVar45 = local_68._8_4_ * auVar26._8_4_;
                    fVar46 = local_68._12_4_ * auVar26._12_4_;
                    auVar47._0_4_ = local_48._0_4_ * fVar25;
                    auVar47._4_4_ = local_48._4_4_ * fVar44;
                    auVar47._8_4_ = local_48._8_4_ * fVar45;
                    auVar47._12_4_ = local_48._12_4_ * fVar46;
                    auVar27 = vsubps_avx(local_68,auVar47);
                    fVar25 = fVar25 + auVar26._0_4_ * auVar27._0_4_;
                    fVar44 = fVar44 + auVar26._4_4_ * auVar27._4_4_;
                    auVar31._4_4_ = fVar44;
                    auVar31._0_4_ = fVar25;
                    auVar40._8_8_ = local_128._0_8_;
                    auVar40._0_8_ = local_128._0_8_;
                    auVar39 = vinsertps_avx(auVar40,auVar37._0_16_,0x30);
                    auVar8._4_8_ = auVar39._8_8_;
                    auVar8._0_4_ = local_68._4_4_ * auVar39._4_4_;
                    auVar30._0_8_ = auVar8._0_8_ << 0x20;
                    auVar30._8_4_ = local_68._8_4_ * auVar39._8_4_;
                    auVar30._12_4_ = local_68._12_4_ * auVar39._12_4_;
                    auVar41._0_4_ = (float)(int)lVar21;
                    auVar41._4_12_ = local_58._4_12_;
                    auVar31._8_8_ = auVar30._8_8_;
                    auVar39 = vrcpps_avx(auVar41);
                    fVar48 = fVar25 * auVar39._0_4_;
                    fVar49 = fVar44 * auVar39._4_4_;
                    fVar50 = auVar30._8_4_ * auVar39._8_4_;
                    fVar51 = auVar30._12_4_ * auVar39._12_4_;
                    auVar52._0_4_ = auVar41._0_4_ * fVar48;
                    auVar52._4_4_ = local_58._4_4_ * fVar49;
                    auVar52._8_4_ = local_58._8_4_ * fVar50;
                    auVar52._12_4_ = local_58._12_4_ * fVar51;
                    auVar34 = vsubps_avx(auVar31,auVar52);
                    auVar32._0_4_ = fVar48 + auVar39._0_4_ * auVar34._0_4_;
                    auVar32._4_4_ = fVar49 + auVar39._4_4_ * auVar34._4_4_;
                    auVar32._8_4_ = fVar50 + auVar39._8_4_ * auVar34._8_4_;
                    auVar32._12_4_ = fVar51 + auVar39._12_4_ * auVar34._12_4_;
                    auVar36._0_4_ = (fVar25 + auVar41._0_4_) * (float)local_88._0_4_;
                    auVar36._4_4_ = (fVar44 + local_58._4_4_) * (float)local_88._4_4_;
                    auVar36._8_4_ =
                         (fVar45 + auVar26._8_4_ * auVar27._8_4_ + local_58._8_4_) * fStack_80;
                    auVar36._12_4_ =
                         (fVar46 + auVar26._12_4_ * auVar27._12_4_ + local_58._12_4_) * fStack_7c;
                    auVar42._0_4_ = auVar32._0_4_ * (float)local_78._0_4_;
                    auVar42._4_4_ = auVar32._4_4_ * (float)local_78._4_4_;
                    auVar42._8_4_ = auVar32._8_4_ * fStack_70;
                    auVar42._12_4_ = auVar32._12_4_ * fStack_6c;
                    auVar39 = vshufpd_avx(auVar42,auVar36,1);
                    auVar26 = vsubps_avx(auVar36,auVar39);
                    auVar9._4_8_ = auVar42._8_8_;
                    auVar9._0_4_ = auVar42._4_4_ + auVar39._4_4_;
                    auVar43._0_8_ = auVar9._0_8_ << 0x20;
                    auVar43._8_4_ = auVar42._8_4_ + auVar39._8_4_;
                    auVar43._12_4_ = auVar42._12_4_ + auVar39._12_4_;
                    auVar39 = vmovshdup_avx(auVar32);
                    auVar33._0_4_ = auVar39._0_4_ * auVar32._0_4_;
                    auVar33._4_4_ = auVar39._4_4_ * auVar32._4_4_;
                    auVar33._8_4_ = auVar39._8_4_ * auVar32._8_4_;
                    auVar33._12_4_ = auVar39._12_4_ * auVar32._12_4_;
                    local_178.xmin = auVar26._0_4_;
                    local_178.ymin = auVar26._4_4_;
                    local_178.area = (float)vextractps_avx(auVar33,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_198.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_150);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_178.score = fVar24;
                    local_178.xmax = auVar43._8_4_;
                    local_178.ymax = auVar43._12_4_;
                    local_178.label = iVar22;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_178);
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar43._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar43._8_8_ >> 0x20);
                      (__position._M_current)->area = local_178.area;
                      (__position._M_current)->label = iVar22;
                      (__position._M_current)->score = fVar24;
                      (__position._M_current)->xmin = local_178.xmin;
                      (__position._M_current)->ymin = local_178.ymin;
                      (__position._M_current)->xmax = auVar43._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  local_e0 = local_e0 + 1;
                  local_e8 = local_e8 + 1;
                  local_f0 = local_f0 + 1;
                  local_f8 = local_f8 + 1;
                  pfVar19 = pfVar19 + 1;
                  lVar21 = lVar21 + 1;
                  in_R10 = local_a8;
                } while (lVar21 != local_a8);
              }
              lVar21 = local_b8 + 1;
            } while (lVar21 != local_100);
          }
          lVar21 = local_150 + 1;
          p_Var4 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
        } while (lVar21 < *(int *)(&this->field_0xd4 + (long)p_Var4));
      }
      if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3])) {
        lVar21 = 8;
        lVar18 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_148,
                     local_148.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_198.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                     *(undefined8 *)
                      ((long)&((local_198.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar18 = lVar18 + 1;
          lVar21 = lVar21 + 0x18;
        } while (lVar18 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_198);
      local_180 = local_180 + 1;
    } while (local_180 <
             (ulong)(((long)(local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_118->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]),&local_148);
  local_178.score = 0.0;
  local_178.xmin = 0.0;
  local_178.ymin = 0.0;
  local_178.xmax = 0.0;
  local_178.ymax = 0.0;
  local_178.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]),&local_148,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar21 = CONCAT44(local_178.xmin,local_178.score);
  if (CONCAT44(local_178.xmax,local_178.ymin) != lVar21) {
    uVar23 = 0;
    do {
      __args = local_148.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar21 + uVar23 * 8);
      if (local_198.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_198.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_198,
                   (iterator)
                   local_198.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        uVar10 = *(undefined8 *)__args;
        uVar11 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_198.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_198.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar10;
        *(undefined8 *)
         ((long)local_198.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar11;
        local_198.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_198.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar23 = uVar23 + 1;
      lVar21 = CONCAT44(local_178.xmin,local_178.score);
    } while (uVar23 < (ulong)(CONCAT44(local_178.xmax,local_178.ymin) - lVar21 >> 3));
  }
  _h = (int)((long)local_198.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_198.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
  iVar12 = 0;
  if (_h != 0) {
    this_01 = (local_d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,_h,4,local_d0->blob_allocator);
    iVar12 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar12 = 0, 0 < (int)_h)) {
      iVar22 = this_01->w;
      sVar20 = this_01->elemsize;
      puVar15 = (undefined4 *)((long)this_01->data + 0x14);
      iVar12 = 0;
      lVar21 = 0;
      do {
        uVar16 = *(undefined4 *)
                  ((long)&((local_198.
                            super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar21);
        puVar15[-5] = (float)(*(int *)((long)&local_198.
                                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1].
                                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar21) +
                             1);
        puVar15[-4] = uVar16;
        puVar15[-3] = *(undefined4 *)
                       ((long)&((local_198.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar21 + 4);
        puVar15[-2] = *(undefined4 *)
                       ((long)&((local_198.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar21);
        puVar15[-1] = *(undefined4 *)
                       ((long)&((local_198.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar21 + 4);
        *puVar15 = *(undefined4 *)
                    ((long)&((local_198.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar21);
        lVar21 = lVar21 + 0x1c;
        puVar15 = (undefined4 *)((long)puVar15 + (long)iVar22 * sVar20);
      } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar21);
    }
  }
  if (local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar6 = (void *)CONCAT44(local_178.xmin,local_178.score);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,CONCAT44(local_178.area,local_178.ymax) - (long)pvVar6);
  }
LAB_002b9402:
  if (local_148.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar12;
}

Assistant:

int Yolov3DetectionOutput_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}